

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O0

StructDeclarationSymbol * __thiscall
psy::C::DeclarationBinder::bindDeclaration<psy::C::StructDeclarationSymbol,psy::C::TagType*>
          (DeclarationBinder *this,SyntaxNode *node,TagType *args)

{
  SyntaxTree *tree;
  SemanticModel *this_00;
  StructDeclarationSymbol *pSVar1;
  Symbol *containingSym;
  reference ppSVar2;
  unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_> local_48;
  StructDeclarationSymbol *local_40;
  StructDeclarationSymbol *decl;
  unique_ptr<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>_>
  local_28;
  unique_ptr<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>_>
  newDecl;
  TagType *args_local;
  SyntaxNode *node_local;
  DeclarationBinder *this_local;
  
  newDecl._M_t.
  super___uniq_ptr_impl<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>_>
  ._M_t.
  super__Tuple_impl<0UL,_psy::C::StructDeclarationSymbol_*,_std::default_delete<psy::C::StructDeclarationSymbol>_>
  .super__Head_base<0UL,_psy::C::StructDeclarationSymbol_*,_false>._M_head_impl =
       (__uniq_ptr_data<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>,_true,_true>
        )(__uniq_ptr_data<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>,_true,_true>
          )args;
  pSVar1 = (StructDeclarationSymbol *)operator_new(0x28);
  containingSym = containingUnitOrDeclaration(this);
  tree = (this->super_SyntaxVisitor).tree_;
  ppSVar2 = std::
            stack<psy::C::Scope_*,_std::deque<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>_>::
            top(&this->scopes_);
  StructDeclarationSymbol::StructDeclarationSymbol
            (pSVar1,containingSym,tree,*ppSVar2,
             (TagType *)
             newDecl._M_t.
             super___uniq_ptr_impl<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_psy::C::StructDeclarationSymbol_*,_std::default_delete<psy::C::StructDeclarationSymbol>_>
             .super__Head_base<0UL,_psy::C::StructDeclarationSymbol_*,_false>._M_head_impl);
  std::
  unique_ptr<psy::C::StructDeclarationSymbol,std::default_delete<psy::C::StructDeclarationSymbol>>::
  unique_ptr<std::default_delete<psy::C::StructDeclarationSymbol>,void>
            ((unique_ptr<psy::C::StructDeclarationSymbol,std::default_delete<psy::C::StructDeclarationSymbol>>
              *)&local_28,pSVar1);
  this_00 = this->semaModel_;
  std::unique_ptr<psy::C::DeclarationSymbol,std::default_delete<psy::C::DeclarationSymbol>>::
  unique_ptr<psy::C::StructDeclarationSymbol,std::default_delete<psy::C::StructDeclarationSymbol>,void>
            ((unique_ptr<psy::C::DeclarationSymbol,std::default_delete<psy::C::DeclarationSymbol>> *
             )&local_48,&local_28);
  pSVar1 = (StructDeclarationSymbol *)SemanticModel::addDeclaration(this_00,node,&local_48);
  std::unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_>::
  ~unique_ptr(&local_48);
  local_40 = pSVar1;
  pushDeclaration(this,(DeclarationSymbol *)pSVar1);
  pSVar1 = local_40;
  std::
  unique_ptr<psy::C::StructDeclarationSymbol,_std::default_delete<psy::C::StructDeclarationSymbol>_>
  ::~unique_ptr(&local_28);
  return pSVar1;
}

Assistant:

DeclSymT* DeclarationBinder::bindDeclaration(const SyntaxNode* node, DeclSymTArgs... args)
{
    std::unique_ptr<DeclSymT> newDecl(
                new DeclSymT(containingUnitOrDeclaration(),
                             tree_,
                             scopes_.top(),
                             std::forward<DeclSymTArgs>(args)...));
    auto decl = static_cast<DeclSymT*>(semaModel_->addDeclaration(node, std::move(newDecl)));
    pushDeclaration(decl);
    return decl;
}